

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_cursor.hpp
# Opt level: O3

void __thiscall
jsoncons::bson::basic_bson_cursor<jsoncons::bytes_source,std::allocator<char>>::
basic_bson_cursor<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
          (basic_bson_cursor<jsoncons::bytes_source,std::allocator<char>> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source,bson_decode_options *options
          ,allocator<char> *alloc)

{
  char cVar1;
  
  *(undefined8 *)this = 0xb30118;
  *(undefined8 *)(this + 0x120) = 0xb301b8;
  basic_bson_parser<jsoncons::bytes_source,std::allocator<char>>::
  basic_bson_parser<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
            ((basic_bson_parser<jsoncons::bytes_source,std::allocator<char>> *)(this + 8),source,
             options,alloc);
  *(undefined ***)(this + 0xb8) = &PTR__basic_json_visitor_00b30320;
  *(undefined2 *)(this + 0xc0) = 3;
  *(undefined4 *)(this + 0xe8) = 0;
  *(undefined8 *)(this + 200) = 0;
  *(undefined8 *)(this + 0xd0) = 0;
  *(undefined8 *)(this + 0xd4) = 0;
  *(undefined8 *)(this + 0xdc) = 0;
  *(undefined8 *)(this + 0xf0) = 0;
  *(undefined8 *)(this + 0xf8) = 0;
  *(undefined8 *)(this + 0x100) = 0;
  *(undefined8 *)(this + 0x108) = 0;
  *(undefined8 *)(this + 0x109) = 0;
  *(undefined8 *)(this + 0x111) = 0;
  this[0x12] = (basic_bson_cursor<jsoncons::bytes_source,std::allocator<char>>)0x1;
  cVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar1 == '\0') {
    (**(code **)(*(long *)this + 0x38))(this);
  }
  return;
}

Assistant:

basic_bson_cursor(Sourceable&& source,
        const bson_decode_options& options = bson_decode_options(),
        const Allocator& alloc = Allocator())
        : parser_(std::forward<Sourceable>(source), options, alloc)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next();
        }
    }